

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O3

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find_last_not_of(StringPiece *this,StringPiece s,size_type pos)

{
  bool bVar1;
  size_type sVar2;
  long lVar3;
  size_type sVar4;
  stringpiece_ssize_type i;
  long lVar5;
  char *data;
  stringpiece_ssize_type length;
  bool lookup [256];
  char acStack_128 [256];
  
  lVar3 = s.length_;
  sVar2 = 0xffffffffffffffff;
  if (0 < this->length_) {
    sVar4 = this->length_ - 1;
    if (pos <= sVar4) {
      sVar4 = pos;
    }
    sVar2 = sVar4;
    if (0 < lVar3) {
      if (lVar3 == 1) {
        do {
          if (this->ptr_[sVar4] != *s.ptr_) {
            return sVar4;
          }
          bVar1 = 0 < (long)sVar4;
          sVar2 = 0xffffffffffffffff;
          sVar4 = sVar4 - 1;
        } while (bVar1);
      }
      else {
        lVar5 = 0;
        memset(acStack_128,0,0x100);
        do {
          acStack_128[(byte)s.ptr_[lVar5]] = '\x01';
          lVar5 = lVar5 + 1;
        } while (lVar3 != lVar5);
        sVar2 = 0xffffffffffffffff;
        if (-1 < (long)sVar4) {
          do {
            if (acStack_128[(byte)this->ptr_[sVar4]] != '\x01') {
              return sVar4;
            }
            bVar1 = 0 < (long)sVar4;
            sVar4 = sVar4 - 1;
          } while (bVar1);
        }
      }
    }
  }
  return sVar2;
}

Assistant:

stringpiece_ssize_type StringPiece::find_last_not_of(StringPiece s,
                                                     size_type pos) const {
  if (length_ <= 0) return npos;

  stringpiece_ssize_type i = std::min(pos, static_cast<size_type>(length_ - 1));
  if (s.length_ <= 0) return i;

  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_last_not_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (; i >= 0; --i) {
    if (!lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
  }
  return npos;
}